

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O0

void __thiscall MockSupport::failTestWithOutOfOrderCalls(MockSupport *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined1 local_a0 [8];
  MockCallOrderFailure failure;
  MockNamedValueListNode *p;
  undefined1 local_20 [8];
  MockExpectedCallsList expectationsList;
  MockSupport *this_local;
  
  expectationsList.head_ = (MockExpectedCallsListNode *)this;
  MockExpectedCallsList::MockExpectedCallsList((MockExpectedCallsList *)local_20);
  MockExpectedCallsList::addExpectations((MockExpectedCallsList *)local_20,&this->expectations_);
  for (failure.super_MockFailure.super_TestFailure.message_.bufferSize_ =
            (size_t)MockNamedValueList::begin(&this->data_);
      failure.super_MockFailure.super_TestFailure.message_.bufferSize_ != 0;
      failure.super_MockFailure.super_TestFailure.message_.bufferSize_ =
           (size_t)MockNamedValueListNode::next
                             ((MockNamedValueListNode *)
                              failure.super_MockFailure.super_TestFailure.message_.bufferSize_)) {
    pMVar2 = getMockSupport(this,(MockNamedValueListNode *)
                                 failure.super_MockFailure.super_TestFailure.message_.bufferSize_);
    if (pMVar2 != (MockSupport *)0x0) {
      pMVar2 = getMockSupport(this,(MockNamedValueListNode *)
                                   failure.super_MockFailure.super_TestFailure.message_.bufferSize_)
      ;
      MockExpectedCallsList::addExpectations
                ((MockExpectedCallsList *)local_20,&pMVar2->expectations_);
    }
  }
  iVar1 = (*this->activeReporter_->_vptr_MockFailureReporter[3])();
  MockCallOrderFailure::MockCallOrderFailure
            ((MockCallOrderFailure *)local_a0,(UtestShell *)CONCAT44(extraout_var,iVar1),
             (MockExpectedCallsList *)local_20);
  (*this->_vptr_MockSupport[0x31])(this,local_a0);
  MockCallOrderFailure::~MockCallOrderFailure((MockCallOrderFailure *)local_a0);
  MockExpectedCallsList::~MockExpectedCallsList((MockExpectedCallsList *)local_20);
  return;
}

Assistant:

void MockSupport::failTestWithOutOfOrderCalls()
{
    MockExpectedCallsList expectationsList;
    expectationsList.addExpectations(expectations_);

    for(MockNamedValueListNode *p = data_.begin();p;p = p->next())
        if(getMockSupport(p))
            expectationsList.addExpectations(getMockSupport(p)->expectations_);

    MockCallOrderFailure failure(activeReporter_->getTestToFail(), expectationsList);
    failTest(failure);
}